

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adfa.cc
# Opt level: O0

void __thiscall
re2c::DFA::DFA(DFA *this,dfa_t *dfa,vector<unsigned_long,_std::allocator<unsigned_long>_> *fill,
              Skeleton *skel,charset_t *charset,string *n,string *c,uint32_t l)

{
  size_t n_00;
  value_type pdVar1;
  long lVar2;
  size_t sVar3;
  undefined1 auVar4 [16];
  const_reference pvVar5;
  dfa_state_t *pdVar6;
  ulong uVar7;
  void *pvVar8;
  State *this_00;
  const_reference ppdVar9;
  const_reference pvVar10;
  Span *pSVar11;
  bool bVar12;
  undefined8 local_e0;
  size_t to;
  uint32_t c_1;
  uint32_t j;
  State *s;
  dfa_state_t *t;
  size_t i_1;
  State **p;
  size_t i;
  State **i2s;
  size_t nchars;
  size_t nstates;
  string *n_local;
  charset_t *charset_local;
  Skeleton *skel_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *fill_local;
  dfa_t *dfa_local;
  DFA *this_local;
  
  uniq_vector_t<const_re2c::State_*>::uniq_vector_t(&this->accepts);
  this->skeleton = skel;
  std::__cxx11::string::string((string *)&this->name,(string *)n);
  std::__cxx11::string::string((string *)&this->cond,(string *)c);
  this->line = l;
  this->lbChar = 0;
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back(charset);
  this->ubChar = *pvVar5;
  this->nStates = 0;
  this->head = (State *)0x0;
  this->max_fill = 0;
  this->need_backup = false;
  this->need_backupctx = false;
  this->need_accept = false;
  pdVar6 = (dfa_state_t *)
           std::vector<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>::size
                     (&dfa->states);
  n_00 = dfa->nchars;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = pdVar6;
  uVar7 = SUB168(auVar4 * ZEXT816(8),0);
  if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  pvVar8 = operator_new__(uVar7);
  for (p = (State **)0x0; p < pdVar6; p = (State **)((long)p + 1)) {
    this_00 = (State *)operator_new(0x58);
    State::State(this_00);
    *(State **)((long)pvVar8 + (long)p * 8) = this_00;
  }
  i_1 = (size_t)&this->head;
  for (t = (dfa_state_t *)0x0; t < pdVar6; t = (dfa_state_t *)((long)&t->arcs + 1)) {
    ppdVar9 = std::vector<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>::operator[]
                        (&dfa->states,(size_type)t);
    pdVar1 = *ppdVar9;
    lVar2 = *(long *)((long)pvVar8 + (long)t * 8);
    this->nStates = this->nStates + 1;
    *(long *)i_1 = lVar2;
    i_1 = lVar2 + 0x10;
    *(byte *)(lVar2 + 0x20) = pdVar1->ctx & 1;
    *(RuleOp **)(lVar2 + 8) = pdVar1->rule;
    pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        (fill,(size_type)t);
    *(value_type *)(lVar2 + 0x18) = *pvVar10;
    pSVar11 = allocate<re2c::Span>(n_00);
    *(Span **)(lVar2 + 0x30) = pSVar11;
    to._4_4_ = 0;
    to._0_4_ = 0;
    while ((uint)to < n_00) {
      sVar3 = pdVar1->arcs[(uint)to];
      do {
        to._0_4_ = (uint)to + 1;
        bVar12 = false;
        if ((uint)to < n_00) {
          bVar12 = pdVar1->arcs[(uint)to] == sVar3;
        }
      } while (bVar12);
      if (sVar3 == 0xffffffffffffffff) {
        local_e0 = 0;
      }
      else {
        local_e0 = *(undefined8 *)((long)pvVar8 + sVar3 * 8);
      }
      *(undefined8 *)(*(long *)(lVar2 + 0x30) + (ulong)to._4_4_ * 0x10 + 8) = local_e0;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (charset,(ulong)(uint)to);
      *(value_type *)(*(long *)(lVar2 + 0x30) + (ulong)to._4_4_ * 0x10) = *pvVar5;
      to._4_4_ = to._4_4_ + 1;
    }
    *(uint *)(lVar2 + 0x28) = to._4_4_;
  }
  *(undefined8 *)i_1 = 0;
  if (pvVar8 != (void *)0x0) {
    operator_delete__(pvVar8);
  }
  return;
}

Assistant:

DFA::DFA
	( const dfa_t &dfa
	, const std::vector<size_t> &fill
	, Skeleton *skel
	, const charset_t &charset
	, const std::string &n
	, const std::string &c
	, uint32_t l
	)
	: accepts ()
	, skeleton (skel)
	, name (n)
	, cond (c)
	, line (l)
	, lbChar(0)
	, ubChar(charset.back())
	, nStates(0)
	, head(NULL)

	// statistics
	, max_fill (0)
	, need_backup (false)
	, need_backupctx (false)
	, need_accept (false)
{
	const size_t nstates = dfa.states.size();
	const size_t nchars = dfa.nchars;

	State **i2s = new State*[nstates];
	for (size_t i = 0; i < nstates; ++i)
	{
		i2s[i] = new State;
	}

	State **p = &head;
	for (size_t i = 0; i < nstates; ++i)
	{
		dfa_state_t *t = dfa.states[i];
		State *s = i2s[i];

		++nStates;
		*p = s;
		p = &s->next;

		s->isPreCtxt = t->ctx;
		s->rule = t->rule;
		s->fill = fill[i];
		s->go.span = allocate<Span>(nchars);
		uint32_t j = 0;
		for (uint32_t c = 0; c < nchars; ++j)
		{
			const size_t to = t->arcs[c];
			for (;++c < nchars && t->arcs[c] == to;);
			s->go.span[j].to = to == dfa_t::NIL ? NULL : i2s[to];
			s->go.span[j].ub = charset[c];
		}
		s->go.nSpans = j;
	}
	*p = NULL;

	delete[] i2s;
}